

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O2

TrackData * __thiscall
DFIDisk::load(TrackData *__return_storage_ptr__,DFIDisk *this,CylHead *cylhead,bool param_2)

{
  uchar uVar1;
  pointer puVar2;
  CylHead *__x;
  mapped_type *pmVar3;
  mapped_type *__range1;
  pointer puVar4;
  int iVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  FluxData flux_revs;
  uint local_8c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  FluxData local_68;
  map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_> *local_48
  ;
  CylHead *local_40;
  TrackData *local_38;
  
  pmVar3 = std::
           map<CylHead,_Data,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
           ::operator[](&this->m_data,cylhead);
  puVar4 = (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 == puVar2) {
    TrackData::TrackData(__return_storage_ptr__,cylhead);
  }
  else {
    local_68.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48 = &this->m_data;
    local_40 = cylhead;
    local_38 = __return_storage_ptr__;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
               (long)((int)puVar2 - (int)puVar4));
    puVar2 = (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar5 = 0;
    for (puVar4 = (pmVar3->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start; __return_storage_ptr__ = local_38,
        __x = local_40, puVar4 != puVar2; puVar4 = puVar4 + 1) {
      uVar1 = *puVar4;
      if ((char)uVar1 < '\0') {
        std::
        vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
        ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    *)&local_68,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
        if (local_88._M_impl.super__Vector_impl_data._M_finish !=
            local_88._M_impl.super__Vector_impl_data._M_start) {
          local_88._M_impl.super__Vector_impl_data._M_finish =
               local_88._M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
                   (long)(*(int *)&(pmVar3->
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(pmVar3->
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
      }
      else {
        iVar5 = iVar5 + (char)uVar1;
        if (uVar1 != '\x7f') {
          local_8c = iVar5 * this->m_tick_ns;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_8c);
          iVar5 = 0;
        }
      }
    }
    if (local_88._M_impl.super__Vector_impl_data._M_start !=
        local_88._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)&local_68,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
    }
    std::
    _Rb_tree<CylHead,_std::pair<const_CylHead,_Data>,_std::_Select1st<std::pair<const_CylHead,_Data>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_Data>_>_>
    ::erase(&local_48->_M_t,__x);
    TrackData::TrackData(__return_storage_ptr__,__x,&local_68,false);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

TrackData load(const CylHead& cylhead, bool /*first_read*/) override
    {
        const auto& data = m_data[cylhead];
        if (data.empty())
            return TrackData(cylhead);

        FluxData flux_revs;
        std::vector<uint32_t> flux_times;
        flux_times.reserve(data.size());

        uint32_t total_time = 0;
        for (auto byte : data)
        {
            if (byte & 0x80)
            {
                flux_revs.push_back(std::move(flux_times));
                flux_times.clear();
                flux_times.reserve(data.size());
            }
            else
            {
                total_time += byte;

                if (byte != 0x7f)
                {
                    flux_times.push_back(total_time * m_tick_ns);
                    total_time = 0;
                }
            }
        }

        if (!flux_times.empty())
            flux_revs.push_back(std::move(flux_times));

        m_data.erase(cylhead);
        return TrackData(cylhead, std::move(flux_revs));
    }